

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O3

uint8_t pack_color_endpoints
                  (vfloat4 color0,vfloat4 color1,vfloat4 rgbs_color,vfloat4 rgbo_color,int format,
                  uint8_t *output,quant_method quant_level)

{
  __m128i alVar1;
  uint8_t i;
  bool bVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar9;
  uint8_t uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  vint4 *in_R8;
  long lVar19;
  vint4 *in_R9;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  int iVar64;
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vfloat4 color0_00;
  vfloat4 color0_01;
  vfloat4 color0_02;
  vfloat4 color;
  vfloat4 color_00;
  vfloat4 color0_03;
  vfloat4 color0_04;
  vfloat4 color0_05;
  vfloat4 color0_06;
  vfloat4 color0_07;
  vfloat4 color0_08;
  vfloat4 color0_09;
  vfloat4 color0_10;
  vfloat4 color0_11;
  vfloat4 color0_12;
  vfloat4 color1_00;
  vfloat4 color1_01;
  vfloat4 color1_02;
  vfloat4 color1_03;
  vfloat4 color1_04;
  vfloat4 color1_05;
  vfloat4 color1_06;
  vfloat4 color1_07;
  vfloat4 color1_08;
  vint4 input0;
  vint4 input0_00;
  vint4 input0_01;
  vint4 input0_02;
  vint4 input0_03;
  vint4 input0_04;
  vint4 input0_05;
  vint4 input0_06;
  vint4 input1;
  vint4 input1_00;
  vint4 input1_01;
  vint4 input1_02;
  vint4 input1_03;
  vint4 input1_04;
  vint4 input1_05;
  vint4 input1_06;
  vint4 color1_out2;
  vint4 color0_unpack;
  vint4 color0_out;
  vint4 color1_out;
  vint4 color1_unpack_1;
  vint4 color0_unpack_1;
  vint4 local_c8;
  vint4 local_b8;
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [16];
  vint4 local_88 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [2] [16];
  undefined1 auVar70 [16];
  
  auVar67._8_56_ = color1._16_56_;
  auVar67._0_8_ = color1.m._8_8_;
  auVar63._8_56_ = color1._8_56_;
  auVar63._0_8_ = color1.m._0_8_;
  auVar54._8_56_ = color0._16_56_;
  auVar54._0_8_ = color0.m._8_8_;
  auVar46._8_56_ = color0._8_56_;
  auVar46._0_8_ = color0.m._0_8_;
  uVar20 = quant_level - QUANT_6;
  if (0x10 < uVar20) {
    __assert_fail("QUANT_6 <= quant_level && quant_level <= QUANT_256",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_color_quantize.cpp"
                  ,0x77e,
                  "uint8_t pack_color_endpoints(vfloat4, vfloat4, vfloat4, vfloat4, int, uint8_t *, quant_method)"
                 );
  }
  uVar10 = '\0';
  if (0xf < (uint)format) {
    return '\0';
  }
  auVar49 = vmaxps_avx(auVar46._0_16_,ZEXT816(0) << 0x40);
  auVar24._8_4_ = 0x477fff00;
  auVar24._0_8_ = 0x477fff00477fff00;
  auVar24._12_4_ = 0x477fff00;
  auVar56 = vminps_avx(auVar49,auVar24);
  auVar49 = vmaxps_avx(auVar54._0_16_,ZEXT816(0) << 0x40);
  auVar49 = vminps_avx(auVar49,auVar24);
  fVar69 = auVar56._0_4_ * 0.0038910506;
  fVar71 = auVar56._4_4_ * 0.0038910506;
  fVar72 = auVar56._12_4_ * 0.0038910506;
  auVar70 = CONCAT412(fVar72,CONCAT48(auVar56._8_4_ * 0.0038910506,CONCAT44(fVar71,fVar69)));
  fVar73 = auVar49._0_4_ * 0.0038910506;
  fVar74 = auVar49._4_4_ * 0.0038910506;
  fVar75 = auVar49._12_4_ * 0.0038910506;
  auVar35 = CONCAT412(fVar75,CONCAT48(auVar49._8_4_ * 0.0038910506,CONCAT44(fVar74,fVar73)));
  puVar8 = &switchD_00273a86::switchdataD_00331f04;
  color0_00.m._8_8_ = auVar49._0_8_;
  auVar57 = auVar67._0_16_;
  color0_00.m._0_8_ = auVar56._0_8_;
  switch(format) {
  case 0:
    auVar49 = vhaddps_avx(auVar70,auVar70);
    auVar56 = vshufpd_avx(auVar70,auVar70,1);
    fVar69 = (auVar56._0_4_ + auVar49._0_4_) * 0.33333334;
    auVar49 = vhaddps_avx(auVar35,auVar35);
    auVar56 = vshufpd_avx(auVar35,auVar35,1);
    fVar71 = (auVar56._0_4_ + auVar49._0_4_) * 0.33333334;
    fVar72 = (fVar69 + fVar71) * 0.5;
    fVar73 = fVar72;
    if (fVar69 <= fVar71) {
      fVar73 = fVar71;
    }
    auVar49 = vcmpss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar69),1);
    auVar49 = vblendvps_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar72),auVar49);
    fVar69 = auVar49._0_4_ + 0.5;
    auVar56 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar69));
    *output = color_unquant_to_uquant_tables[uVar20]
              [(int)((uint)(-0.1 <= auVar49._0_4_ - auVar56._0_4_) + (int)fVar69 * 2)];
    auVar49 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar73 + 0.5)));
    output[1] = color_unquant_to_uquant_tables[uVar20]
                [(int)((uint)(-0.1 <= fVar73 - auVar49._0_4_) + (int)(fVar73 + 0.5) * 2)];
    uVar10 = '\0';
    break;
  case 2:
  case 3:
    auVar24 = vshufpd_avx(auVar56,auVar56,1);
    auVar24 = vinsertps_avx(auVar24,auVar49,0x9c);
    auVar49 = vhaddps_avx(auVar56,auVar49);
    auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
    auVar25._0_4_ = (auVar24._0_4_ + auVar49._0_4_) * 0.33333334;
    auVar25._4_4_ = (auVar24._4_4_ + auVar49._4_4_) * 0.33333334;
    auVar25._8_4_ = (auVar24._8_4_ + auVar49._8_4_) * 0.33333334;
    auVar25._12_4_ = (auVar24._12_4_ + auVar49._12_4_) * 0.33333334;
    auVar49 = vmovshdup_avx(auVar25);
    bVar2 = auVar49._0_4_ < auVar25._0_4_;
    fVar69 = (auVar25._0_4_ + auVar49._0_4_) * 0.5;
    auVar55[1] = bVar2;
    auVar55[0] = bVar2;
    auVar55[2] = bVar2;
    auVar55[3] = bVar2;
    auVar55[4] = bVar2;
    auVar55[5] = bVar2;
    auVar55[6] = bVar2;
    auVar55[7] = bVar2;
    auVar55[8] = bVar2;
    auVar55[9] = bVar2;
    auVar55[10] = bVar2;
    auVar55[0xb] = bVar2;
    auVar55[0xc] = bVar2;
    auVar55[0xd] = bVar2;
    auVar55[0xe] = bVar2;
    auVar55[0xf] = bVar2;
    auVar56 = vpslld_avx(auVar55,0x1f);
    auVar49._4_4_ = fVar69;
    auVar49._0_4_ = fVar69;
    auVar49._8_4_ = fVar69;
    auVar49._12_4_ = fVar69;
    auVar49 = vblendvps_avx(auVar25,auVar49,auVar56);
    auVar26._0_4_ = (int)(auVar49._0_4_ + 0.5);
    auVar26._4_4_ = (int)(auVar49._4_4_ + 0.5);
    auVar26._8_4_ = (int)(auVar49._8_4_ + 0.5);
    auVar26._12_4_ = (int)(auVar49._12_4_ + 0.5);
    if (auVar26._4_4_ - auVar26._0_4_ < 0x801) {
      uVar11 = auVar26._0_4_ + 0x10 >> 5;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if (0x7fe < (int)uVar11) {
        uVar11 = 0x7ff;
      }
      uVar12 = (ulong)uVar20;
      bVar5 = color_unquant_to_uquant_tables[uVar12][uVar11 * 2 + 1 & 0xff];
      if (-1 < (char)bVar5) {
        iVar6 = auVar26._4_4_ + 0x10 >> 5;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0x7fe < iVar6) {
          iVar6 = 0x7ff;
        }
        uVar9 = iVar6 - (uVar11 & 0x780 | (int)(char)bVar5);
        if ((uVar9 < 0x10) &&
           (uVar11 = uVar11 >> 3 & 0xf0,
           bVar4 = *(byte *)(uVar12 * 0x200 + 0x32dd51 + (ulong)(uVar9 | uVar11) * 2),
           uVar11 == (bVar4 & 0xfffffff0))) goto LAB_00273f92;
      }
      uVar9 = auVar26._0_4_ + 0x20 >> 6;
      uVar11 = 0;
      if (0 < (int)uVar9) {
        uVar11 = uVar9;
      }
      if (0x3fe < (int)uVar11) {
        uVar11 = 0x3ff;
      }
      bVar5 = color_unquant_to_uquant_tables[uVar12][uVar11 * 2 & 0x1ff | 0x101];
      if ((char)bVar5 < '\0') {
        iVar64 = auVar26._4_4_ + 0x20 >> 6;
        iVar6 = 0;
        if (0 < iVar64) {
          iVar6 = iVar64;
        }
        if (0x3fe < iVar6) {
          iVar6 = 0x3ff;
        }
        uVar9 = iVar6 - (bVar5 & 0x7f | uVar11 & 0x380);
        if ((uVar9 < 0x20) &&
           (uVar11 = uVar11 >> 2 & 0xe0,
           bVar4 = *(byte *)(uVar12 * 0x200 + 0x32dd51 + (ulong)(uVar9 | uVar11) * 2),
           uVar11 == (bVar4 & 0xffffffe0))) {
LAB_00273f92:
          *output = bVar5;
          output[1] = bVar4;
          return '\x03';
        }
      }
    }
    auVar48._8_4_ = 0x80;
    auVar48._0_8_ = 0x8000000080;
    auVar48._12_4_ = 0x80;
    auVar49 = vpaddd_avx(auVar26,auVar48);
    auVar49 = vpsrad_avx(auVar49,8);
    auVar49 = vpmaxsd_avx(auVar49,(undefined1  [16])0x0);
    auVar65._8_4_ = 0xff;
    auVar65._0_8_ = 0xff000000ff;
    auVar65._12_4_ = 0xff;
    auVar56 = vpminsd_avx(auVar49,auVar65);
    auVar49 = vpslld_avx(auVar56,8);
    auVar24 = vpsubd_avx(auVar49,auVar26);
    auVar49 = vpinsrd_avx(auVar26,auVar26._4_4_ + 0x100,1);
    auVar57 = vpmulld_avx(auVar24,auVar24);
    auVar49 = vpsrad_avx(auVar49,8);
    auVar49 = vpmaxsd_avx(auVar49,(undefined1  [16])0x0);
    auVar24 = vpminsd_avx(auVar49,auVar65);
    auVar49 = vpslld_avx(auVar24,8);
    auVar49 = vpsubd_avx(auVar49,auVar26);
    auVar49 = vpaddd_avx(auVar49,_DAT_00331eb0);
    auVar49 = vpmulld_avx(auVar49,auVar49);
    auVar49 = vphaddd_avx(auVar57,auVar49);
    bVar2 = auVar49._0_4_ < auVar49._8_4_;
    uVar11 = auVar24._4_4_;
    if (bVar2) {
      uVar11 = auVar56._0_4_;
    }
    uVar9 = auVar24._0_4_;
    if (bVar2) {
      uVar9 = auVar56._4_4_;
    }
    *output = *(uint8_t *)((ulong)uVar20 * 0x200 + 0x32dd51 + (ulong)uVar11 * 2);
    output[1] = *(uint8_t *)((ulong)uVar20 * 0x200 + 0x32dd51 + (ulong)uVar9 * 2);
    uVar10 = '\x02';
    break;
  case 4:
    auVar49 = vhaddps_avx(auVar70,auVar70);
    auVar24 = vshufpd_avx(auVar70,auVar70,1);
    auVar56 = vhaddps_avx(auVar35,auVar35);
    fVar69 = (auVar24._0_4_ + auVar49._0_4_) * 0.33333334;
    auVar49 = vshufpd_avx(auVar35,auVar35,1);
    fVar71 = (auVar49._0_4_ + auVar56._0_4_) * 0.33333334;
    auVar49 = vshufps_avx(auVar70,auVar70,0xff);
    auVar56 = vshufps_avx(auVar35,auVar35,0xff);
    uVar11 = (uint)(fVar69 + 0.5);
    fVar73 = auVar49._0_4_;
    fVar72 = auVar56._0_4_;
    if (quant_level < QUANT_192) {
      uVar23 = (uint)(fVar73 + 0.5);
      uVar9 = uVar23 * 2;
      lVar3 = (ulong)uVar20 * 0x200;
      bVar5 = *(byte *)(lVar3 + 0x32dd51 + (ulong)((uVar11 & 0x7f) << 2));
      uVar14 = uVar11 * 2 & 0x100;
      iVar68 = uVar14 + bVar5;
      iVar64 = (int)(fVar71 + 0.5);
      iVar6 = (int)(fVar72 + 0.5);
      uVar22 = iVar64 * 2;
      uVar21 = iVar6 * 2;
      uVar18 = uVar22 - iVar68;
      if (0xffffff7f < uVar18 - 0x40) {
        bVar4 = *(byte *)(lVar3 + 0x32dd51 + (ulong)((uVar23 & 0x7f) << 2));
        iVar17 = (uint)bVar4 + (uVar9 & 0x100);
        uVar7 = uVar21 - iVar17;
        if (0xffffff7f < uVar7 - 0x40) {
          uVar14 = uVar14 >> 1 | uVar18 & 0x7f;
          bVar13 = *(byte *)(lVar3 + 0x32dd51 + (ulong)uVar14 * 2);
          if ((uVar14 ^ bVar13) < 0x40) {
            uVar14 = (uVar9 & 0x100) >> 1 | uVar7 & 0x7f;
            bVar16 = *(byte *)(lVar3 + 0x32dd51 + (ulong)uVar14 * 2);
            if ((((uVar14 ^ bVar16) < 0x40) &&
                ((bVar13 & 0x7f) + iVar68 + ((int)((uint)bVar13 << 0x19) >> 0x1f & 0xffffff80U) <
                 0x200)) &&
               ((bVar16 & 0x7f) + iVar17 + ((int)((uint)bVar16 << 0x19) >> 0x1f & 0xffffff80U) <
                0x200)) {
              *output = bVar5;
              output[1] = bVar13;
              output[2] = bVar4;
              output[3] = bVar16;
              return '\x05';
            }
          }
        }
      }
    }
    else {
      iVar64 = (int)(fVar71 + 0.5);
      uVar22 = iVar64 * 2;
      uVar23 = (uint)(fVar73 + 0.5);
      uVar9 = uVar23 * 2;
      iVar6 = (int)(fVar72 + 0.5);
      uVar21 = iVar6 * 2;
    }
    *output = color_unquant_to_uquant_tables[uVar20]
              [(int)((uint)(-0.1 <= fVar69 - (float)(int)uVar11) | uVar11 * 2)];
    output[1] = color_unquant_to_uquant_tables[uVar20]
                [(int)(-0.1 <= fVar71 - (float)iVar64 | uVar22)];
    output[2] = color_unquant_to_uquant_tables[uVar20]
                [(int)(-0.1 <= fVar73 - (float)(int)uVar23 | uVar9)];
    output[3] = color_unquant_to_uquant_tables[uVar20]
                [(int)(-0.1 <= fVar72 - (float)iVar6 | uVar21)];
    uVar10 = '\x04';
    break;
  case 6:
    color_00.m[2] = (float)(int)color0_00.m._8_8_;
    color_00.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color_00.m[0] = (float)(int)auVar63._0_8_;
    color_00.m[1] = (float)(int)((ulong)auVar63._0_8_ >> 0x20);
    quantize_rgbs(color_00,output,quant_level);
    uVar10 = '\x06';
    break;
  case 7:
    auVar49 = vshufps_avx(auVar57,auVar57,0xff);
    auVar58._0_4_ = auVar49._0_4_ + color1.m[2];
    auVar58._4_4_ = auVar49._4_4_ + color1.m[3];
    auVar58._8_8_ = color1._16_8_;
    auVar56 = vshufps_avx(auVar57,auVar57,0xe9);
    auVar47._0_4_ = auVar56._0_4_ + auVar49._0_4_;
    auVar47._4_4_ = auVar56._4_4_ + auVar49._4_4_;
    auVar47._8_4_ = auVar56._8_4_ + auVar49._8_4_;
    auVar47._12_4_ = auVar56._12_4_ + auVar49._12_4_;
    auVar49 = vshufps_avx(auVar58,auVar47,0x4c);
    auVar49 = vshufps_avx(auVar49,auVar49,0x78);
    auVar49 = vmaxps_avx(auVar49,ZEXT416(0) << 0x20);
    auVar49 = vminps_avx(auVar49,auVar24);
    auVar56 = vmovshdup_avx(auVar49);
    auVar57 = vshufpd_avx(auVar49,auVar49,1);
    local_a8._8_4_ = auVar57._0_4_;
    if ((auVar49._0_4_ <= auVar56._0_4_) ||
       (uVar11 = 0, auVar57 = auVar49, auVar49._0_4_ <= (float)local_a8._8_4_)) {
      if (auVar56._0_4_ <= (float)local_a8._8_4_) {
        auVar57 = vshufps_avx(auVar49,auVar49,0xc6);
        uVar11 = 2;
      }
      else {
        auVar57 = vshufps_avx(auVar49,auVar49,0xe1);
        uVar11 = 1;
      }
    }
    auVar56 = vhsubps_avx(auVar57,auVar57);
    auVar70 = vshufpd_avx(auVar57,auVar57,1);
    fVar69 = auVar57._0_4_;
    auVar35 = vshufps_avx(auVar57,auVar57,0xff);
    auVar57 = vshufps_avx(auVar57,auVar57,0xe9);
    uVar12 = 0;
    lVar3 = (ulong)uVar20 * 0x200;
    auVar79._8_4_ = 0xffffffe0;
    auVar79._0_8_ = 0xffffffe0ffffffe0;
    auVar79._12_4_ = 0xffffffe0;
    auVar80[8] = 0x1f;
    auVar80._0_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar80[9] = 0x1f;
    auVar80[10] = 0x1f;
    auVar80[0xb] = 0x1f;
    auVar80[0xc] = 0x1f;
    auVar80[0xd] = 0x1f;
    auVar80[0xe] = 0x1f;
    auVar80[0xf] = 0x1f;
    do {
      if (((auVar56._0_4_ <=
            (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_cutoffs)
                   [uVar12 * 2]) &&
          (fVar69 - auVar70._0_4_ <=
           (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_cutoffs)
                  [uVar12 * 2])) && (auVar35._0_4_ <= (float)(&DAT_00331fc4)[uVar12 * 2])) {
        uVar9 = (uint)uVar12;
        uVar20 = uVar11 * 4 | uVar9;
        if (uVar12 == 4) {
          uVar20 = uVar11 | 0xc;
        }
        fVar71 = (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_scales)
                        [uVar12];
        fVar72 = (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_rscales)
                        [uVar12];
        uVar22 = (uint)(fVar71 * fVar69 + 0.5);
        uVar15 = (ulong)(uVar20 << 6 | uVar22 & 0x3f);
        do {
          bVar5 = *(byte *)(lVar3 + 0x32dd51 + (uVar15 & 0xff) * 2);
          uVar23 = (uint)(uVar15 & 0xff) & 0xffffffc0;
          uVar21 = bVar5 & 0xffffffc0;
          uVar15 = (ulong)(byte)((char)uVar15 - (uVar23 != uVar21));
        } while (uVar23 != uVar21);
        iVar6 = 1 << ((byte)*(undefined4 *)
                             (quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_bits +
                             uVar12 * 0xc + 4) & 0x1f);
        fVar73 = fVar72 * (float)(int)(bVar5 & 0x3f | uVar22 & 0xffffffc0);
        auVar81._4_4_ = fVar73;
        auVar81._0_4_ = fVar73;
        auVar81._8_4_ = fVar73;
        auVar81._12_4_ = fVar73;
        auVar30 = vsubps_avx(auVar81,auVar57);
        auVar29 = vcmpps_avx(auVar24,auVar30,1);
        auVar30 = vmaxps_avx(auVar30,_DAT_00277060);
        auVar29 = vblendvps_avx(auVar30,auVar24,auVar29);
        auVar77._0_4_ = (uint)(fVar71 * auVar29._0_4_ + 0.5);
        auVar77._4_4_ = (uint)(fVar71 * auVar29._4_4_ + 0.5);
        auVar77._8_4_ = (int)(fVar71 * auVar29._8_4_ + 0.5);
        auVar77._12_4_ = (int)(fVar71 * auVar29._12_4_ + 0.5);
        if ((iVar6 <= (int)auVar77._0_4_) || (iVar6 <= (int)auVar77._4_4_)) goto LAB_00274bde;
        uVar21 = 0;
        uVar23 = 0;
        if (uVar9 < 6) {
          if ((5U >> (uVar9 & 0x1f) & 1) == 0) {
            if ((10U >> (uVar9 & 0x1f) & 1) == 0) {
              uVar23 = auVar77._0_4_ >> 6;
            }
            else {
              uVar23 = uVar22 >> 8;
            }
          }
          else {
            uVar23 = uVar22 >> 9;
          }
          uVar23 = uVar23 & 1;
        }
        if (uVar9 < 4) {
          uVar21 = uVar22 >> 7;
LAB_00274a5a:
          uVar21 = uVar21 & 1;
        }
        else if (uVar9 - 4 < 2) {
          uVar21 = auVar77._4_4_ >> 6;
          goto LAB_00274a5a;
        }
        uVar18 = 0;
        uVar14 = 0;
        if (uVar9 < 6) {
          if ((0x3aU >> (uVar9 & 0x1f) & 1) == 0) {
            uVar14 = uVar22 >> 8;
          }
          else {
            uVar14 = auVar77._0_4_ >> 5;
          }
          uVar14 = uVar14 & 1;
        }
        switch(uVar12 & 0xffffffff) {
        case 0:
          uVar18 = uVar22 >> 10;
          break;
        case 1:
        case 3:
        case 4:
        case 5:
          uVar18 = auVar77._4_4_ >> 5;
          break;
        case 2:
          uVar18 = uVar22 >> 6;
          break;
        default:
          goto switchD_00274a9e_default;
        }
        uVar18 = uVar18 & 1;
switchD_00274a9e_default:
        uVar15 = (ulong)(uVar14 << 5 | uVar23 << 6 | (uVar20 & 4) << 5 | auVar77._0_4_ & 0x1f);
        do {
          bVar4 = *(byte *)(lVar3 + 0x32dd51 + uVar15 * 2);
          uVar23 = (uint)uVar15 & 0xfffffff0;
          uVar15 = (ulong)(byte)((char)uVar15 - (uVar23 != (bVar4 & 0xfffffff0)));
        } while (uVar23 != (bVar4 & 0xfffffff0));
        uVar15 = (ulong)(uVar18 << 5 | uVar21 << 6 | (uVar20 & 8) * 0x10 + (auVar77._4_4_ & 0x1f));
        do {
          bVar13 = *(byte *)(lVar3 + 0x32dd51 + (uVar15 & 0xff) * 2);
          uVar20 = (uint)(uVar15 & 0xff) & 0xfffffff0;
          uVar21 = bVar13 & 0xfffffff0;
          uVar15 = (ulong)(byte)((char)uVar15 - (uVar20 != uVar21));
        } while (uVar20 != uVar21);
        auVar30 = vpinsrb_avx(ZEXT116(bVar4),(uint)bVar13,1);
        auVar29 = vpand_avx(auVar77,auVar79);
        auVar30 = vpand_avx(auVar30,auVar80);
        auVar30 = vpmovzxbd_avx(auVar30);
        auVar29 = vpor_avx(auVar29,auVar30);
        auVar29 = vcvtdq2ps_avx(auVar29);
        auVar76._0_4_ = fVar72 * auVar29._0_4_;
        auVar76._4_4_ = fVar72 * auVar29._4_4_;
        auVar76._8_4_ = fVar72 * auVar29._8_4_;
        auVar76._12_4_ = fVar72 * auVar29._12_4_;
        auVar29 = vsubps_avx(auVar81,auVar76);
        auVar30 = vsubps_avx(auVar29,auVar57);
        auVar29 = vmovshdup_avx(auVar30);
        auVar29 = ZEXT416((uint)(auVar35._0_4_ +
                                (auVar29._0_4_ + auVar30._0_4_ + (fVar73 - fVar69)) * 0.33333334));
        auVar30 = vmaxss_avx(auVar29,ZEXT416(0));
        auVar29 = vcmpss_avx(SUB6416(ZEXT464(0x4e6e6b28),0),auVar29,1);
        auVar78._8_4_ = 0x4e6e6b28;
        auVar78._0_8_ = 0x4e6e6b284e6e6b28;
        auVar78._12_4_ = 0x4e6e6b28;
        auVar29 = vblendvps_avx(auVar30,auVar78,auVar29);
        uVar20 = (uint)(fVar71 * auVar29._0_4_ + 0.5);
        if ((int)uVar20 <
            1 << ((byte)*(undefined4 *)
                         (quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_bits +
                         uVar12 * 0xc + 8) & 0x1f)) {
          uVar11 = uVar20 >> 5;
          if (uVar12 == 1) {
            uVar11 = uVar22 >> 9;
          }
          if (uVar9 == 1) {
            uVar9 = uVar22 >> 10;
          }
          else if (uVar9 == 4) {
            uVar9 = uVar22 >> 7;
          }
          else {
            uVar9 = uVar20 >> 6;
          }
          uVar22 = uVar22 >> 6;
          if (uVar12 == 2) {
            uVar22 = uVar20 >> 7;
          }
          uVar12 = (ulong)(uVar22 << 7 | uVar20 & 0x1f | (uVar11 & 1) << 5 | (uVar9 & 1) << 6);
          do {
            bVar16 = *(byte *)(lVar3 + 0x32dd51 + (uVar12 & 0xff) * 2);
            uVar20 = (uint)(uVar12 & 0xff) & 0xfffffff0;
            uVar11 = bVar16 & 0xfffffff0;
            uVar12 = (ulong)(byte)((char)uVar12 - (uVar20 != uVar11));
          } while (uVar20 != uVar11);
          *output = bVar5;
          output[1] = bVar4;
          output[2] = bVar13;
          output[3] = bVar16;
          return '\a';
        }
      }
LAB_00274bde:
      uVar12 = uVar12 + 1;
      if (uVar12 == 5) {
        local_a8._0_8_ = vmovlpd_avx(auVar49);
        fStack_9c = (float)vextractps_avx(auVar49,3);
        auVar52._8_4_ = 0x477dfc00;
        auVar52._0_8_ = 0x477dfc00477dfc00;
        auVar52._12_4_ = 0x477dfc00;
        auVar49 = vcmpps_avx(auVar52,(undefined1  [16])_local_a8,1);
        auVar56 = vmaxps_avx((undefined1  [16])_local_a8,ZEXT816(0) << 0x40);
        auVar56 = vblendvps_avx(auVar56,auVar52,auVar49);
        auVar49 = vmaskmovps_avx(_DAT_00331ec0,auVar56);
        auVar37._0_4_ = (int)(auVar56._0_4_ * 0.001953125 + 0.5);
        auVar37._4_4_ = (int)(auVar56._4_4_ * 0.001953125 + 0.5);
        auVar37._8_4_ = (int)(auVar56._8_4_ * 0.001953125 + 0.5);
        auVar37._12_4_ = (int)(auVar56._12_4_ * 0.001953125 + 0.5);
        auVar56 = vpmaskmovd_avx2(_DAT_00331ec0,auVar37);
        auVar24 = vcvtdq2ps_avx(auVar37);
        auVar38._0_4_ = auVar24._0_4_ * 512.0;
        auVar38._4_4_ = auVar24._4_4_ * 512.0;
        auVar38._8_4_ = auVar24._8_4_ * 512.0;
        auVar38._12_4_ = auVar24._12_4_ * 512.0;
        auVar24 = vmaskmovps_avx(_DAT_00331ec0,auVar38);
        local_c8.m[0]._0_4_ = auVar24._0_4_;
        local_a8._0_4_ = auVar49._0_4_;
        local_c8.m._4_8_ = auVar24._4_8_;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = local_c8.m._4_8_;
        local_a8._4_8_ = auVar49._4_8_;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_a8._4_8_;
        auVar57 = vsubps_avx(auVar53,auVar61);
        auVar24 = vmovshdup_avx(auVar57);
        fStack_9c = auVar49._12_4_;
        auVar49 = ZEXT416((uint)((((float)local_c8.m[0] - (float)local_a8._0_4_) + auVar57._0_4_ +
                                 auVar24._0_4_) * 0.33333334 + fStack_9c));
        auVar24 = vmaxss_avx(auVar49,ZEXT816(0) << 0x20);
        auVar49 = vcmpss_avx(SUB6416(ZEXT464(0x477dfc00),0),auVar49,1);
        auVar62._8_4_ = 0x42fefc00;
        auVar62._0_8_ = 0x42fefc0042fefc00;
        auVar62._12_4_ = 0x42fefc00;
        auVar49 = vblendvps_avx(ZEXT416((uint)(auVar24._0_4_ * 0.001953125 + 0.5)),auVar62,auVar49);
        local_88[0].m[0]._0_4_ = auVar56._0_4_;
        local_88[0].m._4_8_ = auVar56._4_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_88[0].m._4_8_;
        auVar56 = vpshufd_avx(auVar39,0x50);
        auVar56 = vpblendd_avx2(auVar56,ZEXT416((uint)local_88[0].m[0]),1);
        auVar49 = vpinsrd_avx(auVar56,(int)auVar49._0_4_,3);
        auVar49 = vpand_avx(auVar49,_DAT_00331ed0);
        auVar56 = vpmovzxbd_avx(ZEXT416(0x8080c0));
        auVar56 = vpinsrd_avx(auVar56,((uint)local_88[0].m[0] & 0x40) * 2,3);
        alVar1 = (__m128i)vpor_avx(auVar49,auVar56);
        local_b8.m[0] = alVar1[0];
        local_b8.m[1] = alVar1[1];
        lVar19 = 0;
        do {
          bVar5 = *(byte *)((long)local_b8.m + lVar19 * 4);
          do {
            bVar4 = *(byte *)(lVar3 + 0x32dd51 + (ulong)bVar5 * 2);
            bVar13 = bVar5 & 0xf0;
            bVar16 = bVar4 & 0xf0;
            bVar5 = bVar5 - (bVar13 != bVar16);
          } while (bVar13 != bVar16);
          output[lVar19] = bVar4;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        return '\a';
      }
    } while( true );
  case 8:
    if (quant_level < QUANT_192) {
      color0_02.m[2] = fVar73;
      color0_02.m[3] = fVar74;
      color0_02.m[0] = fVar69;
      color0_02.m[1] = fVar71;
      bVar2 = try_quantize_rgb_delta_blue_contract
                        (color0_02,color1,(vint4 *)local_a8,local_88,quant_level);
      if (bVar2) {
        input0.m[1] = (longlong)&local_c8;
        input0.m[0] = (longlong)&local_b8;
        input1.m[1] = (longlong)puVar8;
        input1.m[0] = extraout_RDX;
        rgba_delta_unpack(input0,input1,in_R8,in_R9);
        auVar49 = vcvtdq2ps_avx((undefined1  [16])local_b8.m);
        auVar63 = ZEXT1664(auVar70);
        auVar56 = vsubps_avx(auVar70,auVar49);
        auVar49 = vcvtdq2ps_avx((undefined1  [16])local_c8.m);
        auVar67 = ZEXT1664(auVar35);
        auVar49 = vsubps_avx(auVar35,auVar49);
        auVar27._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
        auVar27._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
        auVar27._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
        auVar27._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
        auVar49 = vshufpd_avx(auVar27,auVar27,1);
        auVar28._0_4_ = auVar27._0_4_ + auVar49._0_4_;
        auVar28._4_4_ = auVar27._4_4_ + auVar49._4_4_;
        auVar28._8_4_ = auVar27._8_4_ + auVar49._8_4_;
        auVar28._12_4_ = auVar27._12_4_ + auVar49._12_4_;
        local_98 = vhaddps_avx(auVar28,auVar28);
        uVar10 = '\t';
      }
      else {
        local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
        uVar10 = '\0';
      }
      color0_10.m[2] = fVar73;
      color0_10.m[3] = fVar74;
      color0_10.m[0] = fVar69;
      color0_10.m[1] = fVar71;
      color1_06.m._0_8_ = auVar63._0_8_;
      color1_06.m._8_8_ = auVar67._0_8_;
      bVar2 = try_quantize_rgb_delta(color0_10,color1_06,&local_b8,&local_c8,quant_level);
      if (bVar2) {
        input0_04.m[1] = (longlong)local_68;
        input0_04.m[0] = (longlong)local_58;
        input1_04.m[1] = (longlong)puVar8;
        input1_04.m[0] = extraout_RDX_02;
        rgba_delta_unpack(input0_04,input1_04,in_R8,in_R9);
        auVar49 = vcvtdq2ps_avx(local_58[0]);
        auVar56 = vsubps_avx(auVar70,auVar49);
        auVar49 = vcvtdq2ps_avx(local_68);
        auVar49 = vsubps_avx(auVar35,auVar49);
        auVar40._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
        auVar40._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
        auVar40._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
        auVar40._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
        auVar49 = vshufpd_avx(auVar40,auVar40,1);
        auVar41._0_4_ = auVar40._0_4_ + auVar49._0_4_;
        auVar41._4_4_ = auVar40._4_4_ + auVar49._4_4_;
        auVar41._8_4_ = auVar40._8_4_ + auVar49._8_4_;
        auVar41._12_4_ = auVar40._12_4_ + auVar49._12_4_;
        auVar49 = vhaddps_avx(auVar41,auVar41);
        bVar2 = auVar49._0_4_ < (float)local_98._0_4_;
        if (bVar2) {
          local_a8._0_8_ = local_b8.m[0];
          stack0xffffffffffffff60 = local_b8.m[1];
          local_88[0].m[0] = local_c8.m[0];
          local_88[0].m[1] = local_c8.m[1];
          uVar10 = '\t';
          local_98 = auVar49;
        }
      }
LAB_00274e5f:
      color0_11.m[2] = fVar73;
      color0_11.m[3] = fVar74;
      color0_11.m[0] = fVar69;
      color0_11.m[1] = fVar71;
      color1_07.m._0_8_ = auVar63._0_8_;
      color1_07.m._8_8_ = auVar67._0_8_;
      bVar2 = try_quantize_rgb_blue_contract(color0_11,color1_07,&local_b8,&local_c8,quant_level);
      if (bVar2) {
        input0_05.m[1] = (longlong)local_68;
        input0_05.m[0] = (longlong)local_58;
        input1_05.m[1] = (longlong)puVar8;
        input1_05.m[0] = extraout_RDX_03;
        rgba_unpack(input0_05,input1_05,in_R8,in_R9);
        auVar49 = vcvtdq2ps_avx(local_58[0]);
        auVar56 = vsubps_avx(auVar70,auVar49);
        auVar49 = vcvtdq2ps_avx(local_68);
        auVar49 = vsubps_avx(auVar35,auVar49);
        auVar42._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
        auVar42._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
        auVar42._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
        auVar42._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
        auVar49 = vshufpd_avx(auVar42,auVar42,1);
        auVar43._0_4_ = auVar42._0_4_ + auVar49._0_4_;
        auVar43._4_4_ = auVar42._4_4_ + auVar49._4_4_;
        auVar43._8_4_ = auVar42._8_4_ + auVar49._8_4_;
        auVar43._12_4_ = auVar42._12_4_ + auVar49._12_4_;
        auVar49 = vhaddps_avx(auVar43,auVar43);
        bVar2 = auVar49._0_4_ < (float)local_98._0_4_;
        if (bVar2) {
          local_a8._0_8_ = local_b8.m[0];
          stack0xffffffffffffff60 = local_b8.m[1];
          local_88[0].m[0] = local_c8.m[0];
          local_88[0].m[1] = local_c8.m[1];
          uVar10 = '\b';
          local_98 = auVar49;
        }
      }
    }
    else {
      local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
      uVar10 = '\0';
      if (quant_level == QUANT_192) goto LAB_00274e5f;
    }
    color0_12.m[2] = fVar73;
    color0_12.m[3] = fVar74;
    color0_12.m[0] = fVar69;
    color0_12.m[1] = fVar71;
    color1_08.m._0_8_ = auVar63._0_8_;
    color1_08.m._8_8_ = auVar67._0_8_;
    quantize_rgb(color0_12,color1_08,&local_b8,&local_c8,quant_level);
    input0_06.m[1] = (longlong)local_68;
    input0_06.m[0] = (longlong)local_58;
    input1_06.m[1] = (longlong)puVar8;
    input1_06.m[0] = extraout_RDX_04;
    rgba_unpack(input0_06,input1_06,in_R8,in_R9);
    auVar49 = vcvtdq2ps_avx(local_58[0]);
    auVar56 = vsubps_avx(auVar70,auVar49);
    auVar49 = vcvtdq2ps_avx(local_68);
    auVar49 = vsubps_avx(auVar35,auVar49);
    auVar44._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
    auVar44._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
    auVar44._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
    auVar44._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
    auVar49 = vshufpd_avx(auVar44,auVar44,1);
    auVar45._0_4_ = auVar44._0_4_ + auVar49._0_4_;
    auVar45._4_4_ = auVar44._4_4_ + auVar49._4_4_;
    auVar45._8_4_ = auVar44._8_4_ + auVar49._8_4_;
    auVar45._12_4_ = auVar44._12_4_ + auVar49._12_4_;
    auVar49 = vhaddps_avx(auVar45,auVar45);
    if (auVar49._0_4_ < (float)local_98._0_4_) {
      local_a8._0_8_ = local_b8.m[0];
      stack0xffffffffffffff60 = local_b8.m[1];
      local_88[0].m[0] = local_c8.m[0];
      local_88[0].m[1] = local_c8.m[1];
      uVar10 = '\b';
    }
    auVar49 = vpunpcklbw_avx((undefined1  [16])_local_a8,(undefined1  [16])local_88[0].m);
    auVar49 = vpshufd_avx(auVar49,0xe8);
    auVar49 = vpshuflw_avx(auVar49,0xe8);
    *(int *)output = auVar49._0_4_;
    output[4] = local_a8[0];
    output[5] = (uint8_t)local_88[0].m[0];
    break;
  case 10:
    auVar49 = vshufpd_avx(auVar70,auVar70,1);
    auVar56 = vinsertps_avx(auVar49,auVar35,0xcc);
    iVar64 = (int)(auVar56._0_4_ + 0.5);
    iVar68 = (int)(auVar56._4_4_ + 0.5);
    auVar49 = CONCAT412((int)(auVar56._12_4_ + 0.5),
                        CONCAT48((int)(auVar56._8_4_ + 0.5),CONCAT44(iVar68,iVar64)));
    iVar6 = vextractps_avx(auVar49,1);
    auVar49 = vcvtdq2ps_avx(auVar49);
    auVar49 = vsubps_avx(auVar56,auVar49);
    auVar66._8_4_ = 0xbdcccccd;
    auVar66._0_8_ = 0xbdcccccdbdcccccd;
    auVar66._12_4_ = 0xbdcccccd;
    auVar49 = vcmpps_avx(auVar66,auVar49,2);
    auVar49 = vshufps_avx(auVar49,auVar49,0x50);
    uVar11 = vmovmskpd_avx(auVar49);
    output[4] = color_unquant_to_uquant_tables[uVar20][(int)((uVar11 >> 1 & 0x7f) + iVar6 * 2)];
    output[5] = color_unquant_to_uquant_tables[uVar20][(int)((uVar11 & 1) + iVar64 * 2)];
    color.m[2] = (float)iVar64;
    color.m[3] = (float)iVar68;
    color.m[0] = (float)(int)auVar63._0_8_;
    color.m[1] = (float)(int)((ulong)auVar63._0_8_ >> 0x20);
    quantize_rgbs(color,output,quant_level);
    uVar10 = '\n';
    break;
  case 0xb:
    color0_05.m[2] = (float)(int)color0_00.m._8_8_;
    color0_05.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color0_05.m[0] = (float)(int)color0_00.m._0_8_;
    color0_05.m[1] = (float)(int)((ulong)color0_00.m._0_8_ >> 0x20);
    quantize_hdr_rgb(color0_05,color1,output,quant_level);
    uVar10 = '\v';
    break;
  case 0xc:
    if (quant_level < QUANT_192) {
      color0_03.m[2] = fVar73;
      color0_03.m[3] = fVar74;
      color0_03.m[0] = fVar69;
      color0_03.m[1] = fVar71;
      bVar2 = try_quantize_rgb_delta_blue_contract
                        (color0_03,color1,(vint4 *)local_a8,local_88,quant_level);
      local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
      if ((bVar2) &&
         (color0_04.m[2] = fVar69, color0_04.m[3] = fVar71, color0_04.m[0] = fVar73,
         color0_04.m[1] = fVar74, color1_01.m._0_8_ = auVar63._0_8_,
         color1_01.m._8_8_ = auVar67._0_8_,
         bVar2 = try_quantize_alpha_delta
                           (color0_04,color1_01,(vint4 *)local_a8,local_88,quant_level), bVar2)) {
        input0_00.m[1] = (longlong)&local_c8;
        input0_00.m[0] = (longlong)&local_b8;
        input1_00.m[1] = (longlong)puVar8;
        input1_00.m[0] = extraout_RDX_00;
        rgba_delta_unpack(input0_00,input1_00,in_R8,in_R9);
        auVar49 = vcvtdq2ps_avx((undefined1  [16])local_b8.m);
        auVar63 = ZEXT1664(auVar70);
        auVar56 = vsubps_avx(auVar70,auVar49);
        auVar49 = vcvtdq2ps_avx((undefined1  [16])local_c8.m);
        auVar67 = ZEXT1664(auVar35);
        auVar49 = vsubps_avx(auVar35,auVar49);
        auVar29._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
        auVar29._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
        auVar29._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
        auVar29._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
        auVar49 = vshufpd_avx(auVar29,auVar29,1);
        auVar30._0_4_ = auVar29._0_4_ + auVar49._0_4_;
        auVar30._4_4_ = auVar29._4_4_ + auVar49._4_4_;
        auVar30._8_4_ = auVar29._8_4_ + auVar49._8_4_;
        auVar30._12_4_ = auVar29._12_4_ + auVar49._12_4_;
        local_98 = vhaddps_avx(auVar30,auVar30);
        uVar10 = '\r';
      }
      else {
        uVar10 = '\0';
      }
      color0_06.m[2] = fVar73;
      color0_06.m[3] = fVar74;
      color0_06.m[0] = fVar69;
      color0_06.m[1] = fVar71;
      color1_02.m._0_8_ = auVar63._0_8_;
      color1_02.m._8_8_ = auVar67._0_8_;
      bVar2 = try_quantize_rgb_delta(color0_06,color1_02,&local_b8,&local_c8,quant_level);
      if ((bVar2) &&
         (color0_07.m[2] = fVar73, color0_07.m[3] = fVar74, color0_07.m[0] = fVar69,
         color0_07.m[1] = fVar71, color1_03.m._0_8_ = auVar63._0_8_,
         color1_03.m._8_8_ = auVar67._0_8_,
         bVar2 = try_quantize_alpha_delta(color0_07,color1_03,&local_b8,&local_c8,quant_level),
         bVar2)) {
        input0_01.m[1] = (longlong)local_68;
        input0_01.m[0] = (longlong)local_58;
        input1_01.m[1] = (longlong)puVar8;
        input1_01.m[0] = extraout_RDX_01;
        rgba_delta_unpack(input0_01,input1_01,in_R8,in_R9);
        auVar49 = vcvtdq2ps_avx(local_58[0]);
        auVar56 = vsubps_avx(auVar70,auVar49);
        auVar49 = vcvtdq2ps_avx(local_68);
        auVar49 = vsubps_avx(auVar35,auVar49);
        auVar31._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
        auVar31._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
        auVar31._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
        auVar31._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
        auVar49 = vshufpd_avx(auVar31,auVar31,1);
        auVar32._0_4_ = auVar31._0_4_ + auVar49._0_4_;
        auVar32._4_4_ = auVar31._4_4_ + auVar49._4_4_;
        auVar32._8_4_ = auVar31._8_4_ + auVar49._8_4_;
        auVar32._12_4_ = auVar31._12_4_ + auVar49._12_4_;
        auVar49 = vhaddps_avx(auVar32,auVar32);
        bVar2 = auVar49._0_4_ < (float)local_98._0_4_;
        if (bVar2) {
          local_a8._0_8_ = local_b8.m[0];
          stack0xffffffffffffff60 = local_b8.m[1];
          local_88[0].m[0] = local_c8.m[0];
          local_88[0].m[1] = local_c8.m[1];
          uVar10 = '\r';
          local_98 = auVar49;
        }
      }
LAB_002745c1:
      color0_08.m[2] = fVar73;
      color0_08.m[3] = fVar74;
      color0_08.m[0] = fVar69;
      color0_08.m[1] = fVar71;
      color1_04.m._0_8_ = auVar63._0_8_;
      color1_04.m._8_8_ = auVar67._0_8_;
      bVar2 = try_quantize_rgb_blue_contract(color0_08,color1_04,&local_b8,&local_c8,quant_level);
      if (bVar2) {
        auVar49 = vpermilpd_avx(auVar35,1);
        auVar56 = vinsertps_avx(auVar49,ZEXT416((uint)fVar72),0xc);
        auVar50._0_4_ = (int)(auVar56._0_4_ + 0.5);
        auVar50._4_4_ = (int)(auVar56._4_4_ + 0.5);
        auVar50._8_4_ = (int)(auVar56._8_4_ + 0.5);
        auVar50._12_4_ = (int)(auVar56._12_4_ + 0.5);
        iVar6 = vextractps_avx(auVar50,1);
        auVar49 = vcvtdq2ps_avx(auVar50);
        auVar49 = vsubps_avx(auVar56,auVar49);
        auVar59._8_4_ = 0xbdcccccd;
        auVar59._0_8_ = 0xbdcccccdbdcccccd;
        auVar59._12_4_ = 0xbdcccccd;
        auVar63 = ZEXT1664(auVar59);
        auVar49 = vcmpps_avx(auVar59,auVar49,2);
        auVar49 = vshufps_avx(auVar49,auVar49,0x50);
        uVar11 = vmovmskpd_avx(auVar49);
        local_b8.m[1]._4_1_ =
             color_unquant_to_uquant_tables[uVar20][(int)((uVar11 >> 1 & 0x7f) + iVar6 * 2)];
        local_b8.m[1]._5_3_ = 0;
        input1_02.m[0] = (ulong)(uVar11 & 1);
        input1_02.m[1] = (long)(int)((uVar11 & 1) + auVar50._0_4_ * 2);
        local_c8.m[1]._4_1_ = color_unquant_to_uquant_tables[uVar20][input1_02.m[1]];
        local_c8.m[1]._5_3_ = 0;
        input0_02.m[1] = (longlong)local_68;
        input0_02.m[0] = (longlong)local_58;
        rgba_unpack(input0_02,input1_02,in_R8,in_R9);
        auVar49 = vcvtdq2ps_avx(local_58[0]);
        auVar56 = vsubps_avx(auVar70,auVar49);
        auVar49 = vcvtdq2ps_avx(local_68);
        auVar49 = vsubps_avx(auVar35,auVar49);
        auVar33._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
        auVar33._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
        auVar33._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
        auVar33._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
        auVar49 = vshufpd_avx(auVar33,auVar33,1);
        auVar34._0_4_ = auVar33._0_4_ + auVar49._0_4_;
        auVar34._4_4_ = auVar33._4_4_ + auVar49._4_4_;
        auVar34._8_4_ = auVar33._8_4_ + auVar49._8_4_;
        auVar34._12_4_ = auVar33._12_4_ + auVar49._12_4_;
        auVar49 = vhaddps_avx(auVar34,auVar34);
        bVar2 = auVar49._0_4_ < (float)local_98._0_4_;
        if (bVar2) {
          local_a8._0_8_ = local_b8.m[0];
          stack0xffffffffffffff60 = local_b8.m[1];
          local_88[0].m[0] = local_c8.m[0];
          local_88[0].m[1] = local_c8.m[1];
          uVar10 = '\f';
          local_98 = auVar49;
        }
      }
    }
    else {
      local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
      uVar10 = '\0';
      if (quant_level == QUANT_192) goto LAB_002745c1;
    }
    color0_09.m[2] = fVar73;
    color0_09.m[3] = fVar74;
    color0_09.m[0] = fVar69;
    color0_09.m[1] = fVar71;
    color1_05.m._0_8_ = auVar63._0_8_;
    color1_05.m._8_8_ = auVar67._0_8_;
    quantize_rgb(color0_09,color1_05,&local_b8,&local_c8,quant_level);
    auVar49 = vpermilpd_avx(auVar70,1);
    auVar56 = vinsertps_avx(auVar49,ZEXT416((uint)fVar75),0xc);
    auVar51._0_4_ = (int)(auVar56._0_4_ + 0.5);
    auVar51._4_4_ = (int)(auVar56._4_4_ + 0.5);
    auVar51._8_4_ = (int)(auVar56._8_4_ + 0.5);
    auVar51._12_4_ = (int)(auVar56._12_4_ + 0.5);
    iVar6 = vextractps_avx(auVar51,1);
    auVar49 = vcvtdq2ps_avx(auVar51);
    auVar49 = vsubps_avx(auVar56,auVar49);
    auVar60._8_4_ = 0xbdcccccd;
    auVar60._0_8_ = 0xbdcccccdbdcccccd;
    auVar60._12_4_ = 0xbdcccccd;
    auVar49 = vcmpps_avx(auVar60,auVar49,2);
    auVar49 = vshufps_avx(auVar49,auVar49,0x50);
    uVar11 = vmovmskpd_avx(auVar49);
    local_b8.m[1]._4_1_ =
         color_unquant_to_uquant_tables[uVar20][(int)((uVar11 >> 1 & 0x7f) + iVar6 * 2)];
    local_b8.m[1]._5_3_ = 0;
    input1_03.m[0] = (ulong)(uVar11 & 1);
    input1_03.m[1] = (long)(int)((uVar11 & 1) + auVar51._0_4_ * 2);
    local_c8.m[1]._4_1_ = color_unquant_to_uquant_tables[uVar20][input1_03.m[1]];
    local_c8.m[1]._5_3_ = 0;
    input0_03.m[1] = (longlong)local_68;
    input0_03.m[0] = (longlong)local_58;
    rgba_unpack(input0_03,input1_03,in_R8,in_R9);
    auVar49 = vcvtdq2ps_avx(local_58[0]);
    auVar56 = vsubps_avx(auVar70,auVar49);
    auVar49 = vcvtdq2ps_avx(local_68);
    auVar49 = vsubps_avx(auVar35,auVar49);
    auVar35._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar49._0_4_ * auVar49._0_4_;
    auVar35._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar49._4_4_ * auVar49._4_4_;
    auVar35._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar49._8_4_ * auVar49._8_4_;
    auVar35._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar49._12_4_ * auVar49._12_4_;
    auVar49 = vshufpd_avx(auVar35,auVar35,1);
    auVar36._0_4_ = auVar35._0_4_ + auVar49._0_4_;
    auVar36._4_4_ = auVar35._4_4_ + auVar49._4_4_;
    auVar36._8_4_ = auVar35._8_4_ + auVar49._8_4_;
    auVar36._12_4_ = auVar35._12_4_ + auVar49._12_4_;
    auVar49 = vhaddps_avx(auVar36,auVar36);
    if (auVar49._0_4_ < (float)local_98._0_4_) {
      local_a8._0_8_ = local_b8.m[0];
      stack0xffffffffffffff60 = local_b8.m[1];
      local_88[0].m[0] = local_c8.m[0];
      local_88[0].m[1] = local_c8.m[1];
      uVar10 = '\f';
    }
    auVar49 = vpshufb_avx((undefined1  [16])local_88[0].m,SUB6416(ZEXT464(0xc080400),0));
    auVar56 = vpshufb_avx((undefined1  [16])_local_a8,SUB6416(ZEXT464(0xc080400),0));
    auVar49 = vpunpcklbw_avx(auVar56,auVar49);
    *(long *)output = auVar49._0_8_;
    break;
  case 0xe:
    auVar56 = vshufpd_avx(auVar56,auVar56,1);
    auVar49 = vinsertps_avx(auVar56,auVar49,0xcc);
    auVar56._0_4_ = auVar49._0_4_ * 0.0038910506;
    auVar56._4_4_ = auVar49._4_4_ * 0.0038910506;
    auVar56._8_4_ = auVar49._8_4_ * 0.0038910506;
    auVar56._12_4_ = auVar49._12_4_ * 0.0038910506;
    auVar70._8_4_ = 0x437f0000;
    auVar70._0_8_ = 0x437f0000437f0000;
    auVar70._12_4_ = 0x437f0000;
    auVar49 = vcmpps_avx(auVar70,auVar56,1);
    auVar56 = vmaxps_avx(auVar56,ZEXT816(0));
    auVar49 = vblendvps_avx(auVar56,auVar70,auVar49);
    iVar64 = (int)(auVar49._0_4_ + 0.5);
    iVar68 = (int)(auVar49._4_4_ + 0.5);
    auVar56 = CONCAT412((int)(auVar49._12_4_ + 0.5),
                        CONCAT48((int)(auVar49._8_4_ + 0.5),CONCAT44(iVar68,iVar64)));
    iVar6 = vextractps_avx(auVar56,1);
    auVar56 = vcvtdq2ps_avx(auVar56);
    auVar49 = vsubps_avx(auVar49,auVar56);
    auVar57._8_4_ = 0xbdcccccd;
    auVar57._0_8_ = 0xbdcccccdbdcccccd;
    auVar57._12_4_ = 0xbdcccccd;
    auVar49 = vcmpps_avx(auVar57,auVar49,2);
    auVar49 = vshufps_avx(auVar49,auVar49,0x50);
    uVar11 = vmovmskpd_avx(auVar49);
    output[6] = color_unquant_to_uquant_tables[uVar20][(int)((uVar11 >> 1 & 0x7f) + iVar6 * 2)];
    output[7] = color_unquant_to_uquant_tables[uVar20][(int)((uVar11 & 1) + iVar64 * 2)];
    color1_00.m[2] = (float)iVar64;
    color1_00.m[3] = (float)iVar68;
    color1_00.m[0] = -0.1;
    color1_00.m[1] = -0.1;
    quantize_hdr_rgb(color0_00,color1_00,output,quant_level);
    uVar10 = '\x0e';
    break;
  case 0xf:
    color0_01.m[2] = (float)(int)color0_00.m._8_8_;
    color0_01.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color0_01.m[0] = (float)(int)color0_00.m._0_8_;
    color0_01.m[1] = (float)(int)((ulong)color0_00.m._0_8_ >> 0x20);
    quantize_hdr_rgb(color0_01,color1,output,quant_level);
    auVar56 = vpermilps_avx(auVar56,0xff);
    auVar24 = vmaxss_avx(auVar56,ZEXT816(0) << 0x40);
    auVar56 = vcmpss_avx(SUB6416(ZEXT464(0x477f0000),0),auVar56,1);
    auVar56 = vblendvps_avx(ZEXT416((uint)(auVar24._0_4_ + 0.5)),SUB6416(ZEXT464(0x477f0080),0),
                            auVar56);
    auVar49 = vpermilps_avx(auVar49,0xff);
    auVar24 = vmaxss_avx(auVar49,ZEXT816(0) << 0x40);
    auVar49 = vcmpss_avx(SUB6416(ZEXT464(0x477f0000),0),auVar49,1);
    auVar49 = vblendvps_avx(ZEXT416((uint)(auVar24._0_4_ + 0.5)),SUB6416(ZEXT464(0x477f0080),0),
                            auVar49);
    uVar12 = (ulong)uVar20;
    lVar3 = 2;
    lVar19 = -3;
    uVar20 = 0;
    uVar11 = 0x80;
    do {
      uVar9 = 0x80 >> ((byte)lVar3 & 0x1f);
      bVar4 = (char)lVar19 + 9;
      uVar22 = (int)(uVar9 + (int)auVar56._0_4_) >> (bVar4 & 0x1f);
      bVar5 = *(byte *)(uVar12 * 0x200 + 0x32dd51 + (ulong)(uVar20 & 0x80 | uVar22 & 0x7f) * 2);
      if (-1 < (char)((byte)uVar20 ^ bVar5)) {
        uVar21 = 0x20 >> ((byte)lVar3 & 0x1f);
        uVar9 = ((int)(uVar9 + (int)auVar49._0_4_) >> (bVar4 & 0x1f)) -
                (bVar5 & 0x7f | uVar22 & 0xffffff80);
        if (((int)uVar9 < (int)uVar21 && SBORROW4(uVar9,-uVar21) == (int)(uVar9 + uVar21) < 0) &&
           (uVar9 = uVar9 & uVar21 * 2 - 1 |
                    ((int)uVar22 >> 7) << ((char)lVar19 + 7U & 0x1f) | uVar11 & 0x80,
           bVar4 = color_unquant_to_uquant_tables[uVar12][(int)(uVar9 * 2 + 1)],
           (*(uint *)(quantize_hdr_alpha(float,float,unsigned_char*,quant_method)::testbits +
                     lVar3 * 4) & (uVar9 ^ bVar4)) == 0)) {
          output[6] = bVar5;
          goto LAB_00275006;
        }
      }
      lVar3 = lVar3 + -1;
      uVar11 = uVar11 - 0x40;
      uVar20 = uVar20 - 0x80;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0);
    output[6] = color_unquant_to_uquant_tables[uVar12]
                [(int)((int)auVar56._0_4_ + 0x100 >> 8 | 0x101)];
    bVar4 = color_unquant_to_uquant_tables[uVar12][(int)((int)auVar49._0_4_ + 0x100 >> 8 | 0x101)];
LAB_00275006:
    output[7] = bVar4;
    uVar10 = '\x0f';
  }
  return uVar10;
}

Assistant:

uint8_t pack_color_endpoints(
	vfloat4 color0,
	vfloat4 color1,
	vfloat4 rgbs_color,
	vfloat4 rgbo_color,
	int format,
	uint8_t* output,
	quant_method quant_level
) {
	assert(QUANT_6 <= quant_level && quant_level <= QUANT_256);

	// Clamp colors to a valid LDR range
	// Note that HDR has a lower max, handled in the conversion functions
	color0 = clamp(0.0f, 65535.0f, color0);
	color1 = clamp(0.0f, 65535.0f, color1);

	// Pre-scale the LDR value we need to the 0-255 quantizable range
	vfloat4 color0_ldr = color0 * (1.0f  / 257.0f);
	vfloat4 color1_ldr = color1 * (1.0f  / 257.0f);

	uint8_t retval = 0;
	float best_error = ERROR_CALC_DEFAULT;
	vint4 color0_out, color1_out;
	vint4 color0_out2, color1_out2;

	switch (format)
	{
	case FMT_RGB:
		if (quant_level <= QUANT_160)
		{
			if (try_quantize_rgb_delta_blue_contract(color0_ldr, color1_ldr, color0_out, color1_out, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out, color1_out, color0_unpack, color1_unpack);

				retval = FMT_RGB_DELTA;
				best_error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			}

			if (try_quantize_rgb_delta(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGB_DELTA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		if (quant_level < QUANT_256)
		{
			if (try_quantize_rgb_blue_contract(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGB;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		{
			quantize_rgb(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level);

			vint4 color0_unpack;
			vint4 color1_unpack;
			rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

			float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			if (error < best_error)
			{
				retval =  FMT_RGB;
				color0_out = color0_out2;
				color1_out = color1_out2;
			}
		}

		// TODO: Can we vectorize this?
		output[0] = static_cast<uint8_t>(color0_out.lane<0>());
		output[1] = static_cast<uint8_t>(color1_out.lane<0>());
		output[2] = static_cast<uint8_t>(color0_out.lane<1>());
		output[3] = static_cast<uint8_t>(color1_out.lane<1>());
		output[4] = static_cast<uint8_t>(color0_out.lane<2>());
		output[5] = static_cast<uint8_t>(color1_out.lane<2>());
		break;

	case FMT_RGBA:
		if (quant_level <= QUANT_160)
		{
			if (try_quantize_rgba_delta_blue_contract(color0_ldr, color1_ldr, color0_out, color1_out, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out, color1_out, color0_unpack, color1_unpack);

				retval = FMT_RGBA_DELTA;
				best_error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			}

			if (try_quantize_rgba_delta(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGBA_DELTA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		if (quant_level < QUANT_256)
		{
			if (try_quantize_rgba_blue_contract(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGBA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		{
			quantize_rgba(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level);

			vint4 color0_unpack;
			vint4 color1_unpack;
			rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

			float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			if (error < best_error)
			{
				retval =  FMT_RGBA;
				color0_out = color0_out2;
				color1_out = color1_out2;
			}
		}

		// TODO: Can we vectorize this?
		output[0] = static_cast<uint8_t>(color0_out.lane<0>());
		output[1] = static_cast<uint8_t>(color1_out.lane<0>());
		output[2] = static_cast<uint8_t>(color0_out.lane<1>());
		output[3] = static_cast<uint8_t>(color1_out.lane<1>());
		output[4] = static_cast<uint8_t>(color0_out.lane<2>());
		output[5] = static_cast<uint8_t>(color1_out.lane<2>());
		output[6] = static_cast<uint8_t>(color0_out.lane<3>());
		output[7] = static_cast<uint8_t>(color1_out.lane<3>());
		break;

	case FMT_RGB_SCALE:
		quantize_rgbs(rgbs_color, output, quant_level);
		retval = FMT_RGB_SCALE;
		break;

	case FMT_HDR_RGB_SCALE:
		quantize_hdr_rgbo(rgbo_color, output, quant_level);
		retval = FMT_HDR_RGB_SCALE;
		break;

	case FMT_HDR_RGB:
		quantize_hdr_rgb(color0, color1, output, quant_level);
		retval = FMT_HDR_RGB;
		break;

	case FMT_RGB_SCALE_ALPHA:
		quantize_rgbs_alpha(color0_ldr, color1_ldr, rgbs_color, output, quant_level);
		retval = FMT_RGB_SCALE_ALPHA;
		break;

	case FMT_HDR_LUMINANCE_SMALL_RANGE:
	case FMT_HDR_LUMINANCE_LARGE_RANGE:
		if (try_quantize_hdr_luminance_small_range(color0, color1, output, quant_level))
		{
			retval = FMT_HDR_LUMINANCE_SMALL_RANGE;
			break;
		}
		quantize_hdr_luminance_large_range(color0, color1, output, quant_level);
		retval = FMT_HDR_LUMINANCE_LARGE_RANGE;
		break;

	case FMT_LUMINANCE:
		quantize_luminance(color0_ldr, color1_ldr, output, quant_level);
		retval = FMT_LUMINANCE;
		break;

	case FMT_LUMINANCE_ALPHA:
		if (quant_level <= 18)
		{
			if (try_quantize_luminance_alpha_delta(color0_ldr, color1_ldr, output, quant_level))
			{
				retval = FMT_LUMINANCE_ALPHA_DELTA;
				break;
			}
		}
		quantize_luminance_alpha(color0_ldr, color1_ldr, output, quant_level);
		retval = FMT_LUMINANCE_ALPHA;
		break;

	case FMT_HDR_RGB_LDR_ALPHA:
		quantize_hdr_rgb_ldr_alpha(color0, color1, output, quant_level);
		retval = FMT_HDR_RGB_LDR_ALPHA;
		break;

	case FMT_HDR_RGBA:
		quantize_hdr_rgb_alpha(color0, color1, output, quant_level);
		retval = FMT_HDR_RGBA;
		break;
	}

	return retval;
}